

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

t_scalar * scalar_new(_glist *owner,t_symbol *templatesym)

{
  int iVar1;
  t_template *template;
  anon_union_8_2_4cf7151e_for_gp_un aVar2;
  t_gpointer gp;
  anon_union_8_2_4cf7151e_for_gp_un local_38;
  int local_30;
  t_gstub *local_28;
  
  local_28 = (t_gstub *)0x0;
  local_30 = 0;
  local_38.gp_scalar = (_scalar *)0x0;
  template = template_findbyname(templatesym);
  if (template == (t_template *)0x0) {
    aVar2.gp_scalar = (t_scalar *)0x0;
    pd_error((void *)0x0,"scalar: couldn\'t find template %s",templatesym->s_name);
  }
  else {
    iVar1 = template_cancreate(template);
    if (iVar1 == 0) {
      aVar2.gp_scalar = (t_scalar *)0x0;
    }
    else {
      aVar2.gp_scalar = (_scalar *)getbytes((long)template->t_n * 8 + 0x18);
      ((aVar2.gp_scalar)->sc_gobj).g_pd = scalar_class;
      (aVar2.gp_scalar)->sc_template = templatesym;
      if (local_28 != (t_gstub *)0x0) {
        gstub_dis(local_28);
      }
      local_28 = owner->gl_stub;
      local_30 = owner->gl_valid;
      local_28->gs_refcount = local_28->gs_refcount + 1;
      local_38.gp_scalar = aVar2.gp_scalar;
      word_init((aVar2.gp_scalar)->sc_vec,template,(t_gpointer *)&local_38);
    }
  }
  return aVar2.gp_scalar;
}

Assistant:

t_scalar *scalar_new(t_glist *owner, t_symbol *templatesym)
{
    t_scalar *x;
    t_template *template;
    t_gpointer gp;
    gpointer_init(&gp);
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return (0);
    }
    if (!template_cancreate(template))
        return (0);
    x = (t_scalar *)getbytes(sizeof(t_scalar) +
        (template->t_n - 1) * sizeof(*x->sc_vec));
    x->sc_gobj.g_pd = scalar_class;
    x->sc_template = templatesym;
    gpointer_setglist(&gp, owner, x);
    word_init(x->sc_vec, template, &gp);
    return (x);
}